

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::prepareUniforms
          (LengthOfVectorAndMatrixTest *this,program *program)

{
  TYPES TVar1;
  reference pvVar2;
  TestError *this_00;
  testCase *test_case;
  program *program_local;
  LengthOfVectorAndMatrixTest *this_local;
  
  if ((this->m_is_compute_program & 1U) != 0) {
    pvVar2 = std::
             vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
             ::operator[](&this->m_test_cases,(ulong)this->m_current_test_case_index);
    TVar1 = pvVar2->m_type;
    if (TVar1 == FLOAT) {
      Utils::program::uniform
                (program,"uni_variable",FLOAT,pvVar2->m_n_cols,pvVar2->m_n_rows,
                 prepareUniforms::float_data);
    }
    else if (TVar1 == INT) {
      Utils::program::uniform
                (program,"uni_variable",INT,1,pvVar2->m_n_rows,prepareUniforms::int_data);
    }
    else {
      if (TVar1 != UINT) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x3be0);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      Utils::program::uniform
                (program,"uni_variable",UINT,1,pvVar2->m_n_rows,prepareUniforms::uint_data);
    }
  }
  return;
}

Assistant:

void LengthOfVectorAndMatrixTest::prepareUniforms(Utils::program& program)
{
	static const GLfloat float_value = 0.125;
	static const GLint   int_value   = -1;
	static const GLuint  uint_value  = 1;

	static const GLfloat float_data[16] = { float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value,
											float_value, float_value, float_value, float_value };

	static const GLint int_data[4] = { int_value, int_value, int_value, int_value };

	static const GLuint uint_data[4] = { uint_value, uint_value, uint_value, uint_value };

	if (false == m_is_compute_program)
	{
		return;
	}

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	switch (test_case.m_type)
	{
	case Utils::FLOAT:
		program.uniform("uni_variable", Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows, float_data);
		break;
	case Utils::INT:
		program.uniform("uni_variable", Utils::INT, 1 /* columns */, test_case.m_n_rows, int_data);
		break;
	case Utils::UINT:
		program.uniform("uni_variable", Utils::UINT, 1 /* columns */, test_case.m_n_rows, uint_data);
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}